

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void goodform::json::serialize(any *v,ostream *output)

{
  bool bVar1;
  bool *pbVar2;
  long *plVar3;
  unsigned_long *puVar4;
  double *pdVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  char *pcVar6;
  ostream *output_local;
  any *v_local;
  
  bVar1 = is<decltype(nullptr)>(v);
  if (bVar1) {
    std::operator<<(output,"null");
  }
  else {
    bVar1 = is<bool>(v);
    if (bVar1) {
      pbVar2 = get<bool>(v);
      pcVar6 = "false";
      if ((*pbVar2 & 1U) != 0) {
        pcVar6 = "true";
      }
      std::operator<<(output,pcVar6);
    }
    else {
      bVar1 = is<long>(v);
      if (bVar1) {
        plVar3 = get<long>(v);
        std::ostream::operator<<(output,*plVar3);
      }
      else {
        bVar1 = is<unsigned_long>(v);
        if (bVar1) {
          puVar4 = get<unsigned_long>(v);
          std::ostream::operator<<(output,*puVar4);
        }
        else {
          bVar1 = is<double>(v);
          if (bVar1) {
            pdVar5 = get<double>(v);
            std::ostream::operator<<(output,*pdVar5);
          }
          else {
            bVar1 = is<std::__cxx11::string>(v);
            if (bVar1) {
              input = get<std::__cxx11::string>(v);
              write_string(input,output);
            }
            else {
              bVar1 = is<std::vector<std::any,std::allocator<std::any>>>(v);
              if (bVar1) {
                stringify_array(v,output);
              }
              else {
                bVar1 = is<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                                  (v);
                if (bVar1) {
                  stringify_object(v,output);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void json::serialize(const any& v, std::ostream& output)
  {
    if (is<std::nullptr_t>(v))
    {
      output << "null";
    }
    else if (is<bool>(v))
    {
      output << (get<bool>(v) ? "true":"false");
    }
    else if (is<std::int64_t>(v)) output << get<std::int64_t>(v);
    else if (is<std::uint64_t>(v)) output << get<std::uint64_t>(v);
    else if (is<double>(v)) output << get<double>(v);
    else if (is<std::string>(v))
    {
      write_string(get<std::string>(v), output);
    }
    else if (is<goodform::array_t>(v))
    {
      stringify_array(v, output);
    }
    else if (is<goodform::object_t>(v))
    {
      stringify_object(v, output);
    }
  }